

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerVk.cpp
# Opt level: O0

IDeviceObject * __thiscall
Diligent::ShaderVariableManagerVk::Get
          (ShaderVariableManagerVk *this,Uint32 ArrayIndex,Uint32 ResIndex)

{
  undefined8 uVar1;
  ResourceCacheContentType CacheType;
  Uint32 UVar2;
  uint uVar3;
  PipelineResourceDesc *Args_1;
  ResourceAttribs *this_00;
  Char *Message;
  DescriptorSet *this_01;
  Resource *pRVar4;
  IDeviceObject *pIVar5;
  Resource *CachedRes;
  DescriptorSet *Set;
  undefined1 local_58 [8];
  string msg;
  Uint32 CacheOffset;
  PipelineResourceAttribsVk *Attribs;
  PipelineResourceDesc *ResDesc;
  Uint32 ResIndex_local;
  Uint32 ArrayIndex_local;
  ShaderVariableManagerVk *this_local;
  
  Args_1 = GetResourceDesc(this,ResIndex);
  this_00 = GetResourceAttribs(this,ResIndex);
  CacheType = ShaderResourceCacheVk::GetContentType
                        ((this->
                         super_ShaderVariableManagerBase<Diligent::EngineVkImplTraits,_Diligent::ShaderVariableVkImpl>
                         ).m_ResourceCache);
  msg.field_2._12_4_ = PipelineResourceAttribsVk::CacheOffset(this_00,CacheType);
  if (Args_1->ArraySize <= ArrayIndex) {
    FormatString<char[26],char[31]>
              ((string *)local_58,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ArrayIndex < ResDesc.ArraySize",(char (*) [31])Args_1);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"Get",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
               ,0x293);
    std::__cxx11::string::~string((string *)local_58);
  }
  uVar1 = *(undefined8 *)this_00;
  UVar2 = ShaderResourceCacheVk::GetNumDescriptorSets
                    ((this->
                     super_ShaderVariableManagerBase<Diligent::EngineVkImplTraits,_Diligent::ShaderVariableVkImpl>
                     ).m_ResourceCache);
  if (((uint)((ulong)uVar1 >> 0x3e) & 1) < UVar2) {
    this_01 = ShaderResourceCacheVk::GetDescriptorSet
                        ((this->
                         super_ShaderVariableManagerBase<Diligent::EngineVkImplTraits,_Diligent::ShaderVariableVkImpl>
                         ).m_ResourceCache,(uint)((ulong)*(undefined8 *)this_00 >> 0x3e) & 1);
    uVar3 = msg.field_2._12_4_ + ArrayIndex;
    UVar2 = ShaderResourceCacheVk::DescriptorSet::GetSize(this_01);
    if (uVar3 < UVar2) {
      pRVar4 = ShaderResourceCacheVk::DescriptorSet::GetResource
                         (this_01,msg.field_2._12_4_ + ArrayIndex);
      pIVar5 = Diligent::RefCntAutoPtr::operator_cast_to_IDeviceObject_
                         ((RefCntAutoPtr *)&pRVar4->pObject);
      return pIVar5;
    }
  }
  return (IDeviceObject *)0x0;
}

Assistant:

IDeviceObject* ShaderVariableManagerVk::Get(Uint32 ArrayIndex, Uint32 ResIndex) const
{
    const PipelineResourceDesc&      ResDesc     = GetResourceDesc(ResIndex);
    const PipelineResourceAttribsVk& Attribs     = GetResourceAttribs(ResIndex);
    const Uint32                     CacheOffset = Attribs.CacheOffset(m_ResourceCache.GetContentType());

    VERIFY_EXPR(ArrayIndex < ResDesc.ArraySize);

    if (Attribs.DescrSet < m_ResourceCache.GetNumDescriptorSets())
    {
        const ShaderResourceCacheVk::DescriptorSet& Set = const_cast<const ShaderResourceCacheVk&>(m_ResourceCache).GetDescriptorSet(Attribs.DescrSet);
        if (CacheOffset + ArrayIndex < Set.GetSize())
        {
            const ShaderResourceCacheVk::Resource& CachedRes = Set.GetResource(CacheOffset + ArrayIndex);
            return CachedRes.pObject;
        }
    }

    return nullptr;
}